

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

clock_t __thiscall trackerboy::apu::Sweep::clock(Sweep *this)

{
  byte bVar1;
  clock_t extraout_RAX;
  Sweep *pSVar2;
  short sVar3;
  PulseChannel *in_RSI;
  uint16_t local_1a;
  int16_t sweepfreq;
  PulseChannel *ch1_local;
  Sweep *this_local;
  
  pSVar2 = this;
  if (this->mTime != '\0') {
    bVar1 = this->mCounter + 1;
    this->mCounter = bVar1;
    pSVar2 = (Sweep *)(ulong)bVar1;
    if ((this->mTime <= bVar1) && (this->mCounter = '\0', pSVar2 = this, this->mShift != '\0')) {
      sVar3 = (short)((int)(uint)this->mShadow >> (this->mShift & 0x1f));
      if ((this->mSubtraction & 1U) == 0) {
        local_1a = this->mShadow + sVar3;
        if (0x7ff < (short)local_1a) {
          Channel::disable(&in_RSI->super_Channel);
          return extraout_RAX;
        }
      }
      else {
        local_1a = this->mShadow - sVar3;
        if ((short)local_1a < 0) {
          return (ulong)(uint)(int)(short)local_1a;
        }
      }
      PulseChannel::setFrequency(in_RSI,local_1a);
      this->mShadow = local_1a;
    }
  }
  return (clock_t)pSVar2;
}

Assistant:

void Sweep::clock(PulseChannel &ch1) noexcept {
    if (mTime) {
        if (++mCounter >= mTime) {
            mCounter = 0;
            if (mShift) {
                int16_t sweepfreq = mShadow >> mShift;
                if (mSubtraction) {
                    sweepfreq = mShadow - sweepfreq;
                    if (sweepfreq < 0) {
                        return; // no change
                    }
                } else {
                    sweepfreq = mShadow + sweepfreq;
                    if (sweepfreq > GB_MAX_FREQUENCY) {
                        // sweep will overflow, disable the channel
                        ch1.disable();
                        return;
                    }
                }
                // no overflow/underflow
                // write-back the shadow register to CH1's frequency register
                ch1.setFrequency((uint16_t)sweepfreq);
                mShadow = sweepfreq;
            }
        }
    }
}